

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3QuoteValue(StrAccum *pStr,sqlite3_value *pValue)

{
  sqlite3_value *p;
  int iVar1;
  char *pcVar2;
  sqlite3_int64 sVar3;
  void *pvVar4;
  long lVar5;
  uchar *puVar6;
  uchar *zArg;
  int i;
  char *zText;
  i64 nBlob;
  char *zBlob;
  char *zVal;
  double r2;
  double r1;
  sqlite3_value *pValue_local;
  StrAccum *pStr_local;
  
  r1 = (double)pValue;
  pValue_local = (sqlite3_value *)pStr;
  iVar1 = sqlite3_value_type(pValue);
  p = pValue_local;
  switch(iVar1) {
  case 1:
    sVar3 = sqlite3_value_int64((sqlite3_value *)r1);
    sqlite3_str_appendf((StrAccum *)p,"%lld",sVar3);
    break;
  case 2:
    r2 = sqlite3_value_double((sqlite3_value *)r1);
    sqlite3_str_appendf((StrAccum *)pValue_local,"%!.15g",r2);
    pcVar2 = sqlite3_str_value((sqlite3_str *)pValue_local);
    if (pcVar2 != (char *)0x0) {
      sqlite3AtoF(pcVar2,(double *)&zVal,*(int *)&pValue_local->db,'\x01');
      if ((r2 != (double)zVal) || (NAN(r2) || NAN((double)zVal))) {
        sqlite3_str_reset((StrAccum *)pValue_local);
        sqlite3_str_appendf((StrAccum *)pValue_local,"%!.20e",r2);
      }
    }
    break;
  case 3:
    puVar6 = sqlite3_value_text((sqlite3_value *)r1);
    sqlite3_str_appendf((StrAccum *)pValue_local,"%Q",puVar6);
    break;
  case 4:
    pvVar4 = sqlite3_value_blob((sqlite3_value *)r1);
    iVar1 = sqlite3_value_bytes((sqlite3_value *)r1);
    lVar5 = (long)iVar1;
    sqlite3StrAccumEnlarge((StrAccum *)pValue_local,lVar5 * 2 + 4);
    if (*(char *)((long)&pValue_local->db + 4) == '\0') {
      pcVar2 = pValue_local->z;
      for (zArg._4_4_ = 0; zArg._4_4_ < lVar5; zArg._4_4_ = zArg._4_4_ + 1) {
        pcVar2[zArg._4_4_ * 2 + 2] =
             "0123456789ABCDEF"[(int)((int)*(char *)((long)pvVar4 + (long)zArg._4_4_) >> 4 & 0xf)];
        pcVar2[zArg._4_4_ * 2 + 3] =
             "0123456789ABCDEF"[(int)((int)*(char *)((long)pvVar4 + (long)zArg._4_4_) & 0xf)];
      }
      pcVar2[lVar5 * 2 + 2] = '\'';
      pcVar2[lVar5 * 2 + 3] = '\0';
      *pcVar2 = 'X';
      pcVar2[1] = '\'';
      *(int *)&pValue_local->db = iVar1 * 2 + 3;
    }
    break;
  default:
    sqlite3_str_append((sqlite3_str *)pValue_local,"NULL",4);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3QuoteValue(StrAccum *pStr, sqlite3_value *pValue){
  /* As currently implemented, the string must be initially empty.
  ** we might relax this requirement in the future, but that will
  ** require enhancements to the implementation. */
  assert( pStr!=0 && pStr->nChar==0 );

  switch( sqlite3_value_type(pValue) ){
    case SQLITE_FLOAT: {
      double r1, r2;
      const char *zVal;
      r1 = sqlite3_value_double(pValue);
      sqlite3_str_appendf(pStr, "%!.15g", r1);
      zVal = sqlite3_str_value(pStr);
      if( zVal ){
        sqlite3AtoF(zVal, &r2, pStr->nChar, SQLITE_UTF8);
        if( r1!=r2 ){
          sqlite3_str_reset(pStr);
          sqlite3_str_appendf(pStr, "%!.20e", r1);
        }
      }
      break;
    }
    case SQLITE_INTEGER: {
      sqlite3_str_appendf(pStr, "%lld", sqlite3_value_int64(pValue));
      break;
    }
    case SQLITE_BLOB: {
      char const *zBlob = sqlite3_value_blob(pValue);
      i64 nBlob = sqlite3_value_bytes(pValue);
      assert( zBlob==sqlite3_value_blob(pValue) ); /* No encoding change */
      sqlite3StrAccumEnlarge(pStr, nBlob*2 + 4);
      if( pStr->accError==0 ){
        char *zText = pStr->zText;
        int i;
        for(i=0; i<nBlob; i++){
          zText[(i*2)+2] = hexdigits[(zBlob[i]>>4)&0x0F];
          zText[(i*2)+3] = hexdigits[(zBlob[i])&0x0F];
        }
        zText[(nBlob*2)+2] = '\'';
        zText[(nBlob*2)+3] = '\0';
        zText[0] = 'X';
        zText[1] = '\'';
        pStr->nChar = nBlob*2 + 3;
      }
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *zArg = sqlite3_value_text(pValue);
      sqlite3_str_appendf(pStr, "%Q", zArg);
      break;
    }
    default: {
      assert( sqlite3_value_type(pValue)==SQLITE_NULL );
      sqlite3_str_append(pStr, "NULL", 4);
      break;
    }
  }
}